

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O1

void __thiscall ThreadPool::Start(ThreadPool *this,int threadNum)

{
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  *this_00;
  pointer *ppuVar1;
  iterator __position;
  Thread *this_01;
  ulong uVar2;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ulong local_40;
  _Head_base<0UL,_Thread_*,_false> local_38;
  
  if (this->m_bRunning == true) {
    Stop(this);
  }
  this_00 = &this->m_threads;
  std::
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ::reserve(this_00,(long)threadNum);
  this->m_bRunning = true;
  if (0 < threadNum) {
    uVar2 = 0;
    local_40 = (ulong)(uint)threadNum;
    do {
      this_01 = (Thread *)operator_new(0x30);
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = operator_new(0x18);
      *(code **)local_68._M_unused._0_8_ = RunInThread;
      *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
      *(ThreadPool **)((long)local_68._M_unused._0_8_ + 0x10) = this;
      pcStack_50 = std::
                   _Function_handler<void_(),_std::_Bind<void_(ThreadPool::*(ThreadPool_*))()>_>::
                   _M_invoke;
      local_58 = std::_Function_handler<void_(),_std::_Bind<void_(ThreadPool::*(ThreadPool_*))()>_>
                 ::_M_manager;
      Thread::Thread(this_01,(CallFunc *)&local_68);
      __position._M_current =
           (this->m_threads).
           super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38._M_head_impl = this_01;
      if (__position._M_current ==
          (this->m_threads).
          super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<Thread,std::default_delete<Thread>>,std::allocator<std::unique_ptr<Thread,std::default_delete<Thread>>>>
        ::_M_realloc_insert<Thread*>
                  ((vector<std::unique_ptr<Thread,std::default_delete<Thread>>,std::allocator<std::unique_ptr<Thread,std::default_delete<Thread>>>>
                    *)this_00,__position,&local_38._M_head_impl);
      }
      else {
        ((__position._M_current)->_M_t).super___uniq_ptr_impl<Thread,_std::default_delete<Thread>_>.
        _M_t.super__Tuple_impl<0UL,_Thread_*,_std::default_delete<Thread>_>.
        super__Head_base<0UL,_Thread_*,_false>._M_head_impl = this_01;
        ppuVar1 = &(this->m_threads).
                   super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      Thread::Start((Thread *)
                    (this_00->
                    super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
                    super___uniq_ptr_impl<Thread,_std::default_delete<Thread>_>);
      uVar2 = uVar2 + 1;
    } while (local_40 != uVar2);
  }
  return;
}

Assistant:

void ThreadPool::Start(int threadNum)
{
	if (m_bRunning)
	{
		Stop();
	}
	
	m_threads.reserve(threadNum);
	m_bRunning = true;
	for (int i = 0; i < threadNum; ++i)
	{
		m_threads.emplace_back(new Thread(std::bind(&ThreadPool::RunInThread, this)));
		m_threads[i]->Start();
	}
}